

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O3

void * smalloc(small_alloc *alloc,size_t size)

{
  byte bVar1;
  small_mempool *psVar2;
  small_mempool_group *psVar3;
  mslab *slab;
  rlist *prVar4;
  rlist *prVar5;
  small_mempool *psVar6;
  uint uVar7;
  int iVar8;
  rlist *prVar9;
  size_t *psVar10;
  slab *psVar11;
  slab *psVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  small_mempool *psVar16;
  small_mempool *psVar17;
  uint uVar18;
  small_mempool *psVar19;
  small_mempool *psVar20;
  ulong uVar21;
  
  if (alloc->objsize_max < size) {
    psVar11 = slab_get_large(alloc->cache,size);
    psVar12 = psVar11 + 1;
    if (psVar11 == (slab *)0x0) {
      psVar12 = (slab *)0x0;
    }
  }
  else {
    uVar13 = (alloc->small_class).size_shift_plus_1;
    uVar15 = (uint)size - uVar13;
    if ((uint)size < uVar13) {
      uVar15 = 0;
    }
    uVar15 = uVar15 >> ((byte)(alloc->small_class).ignore_bits_count & 0x1f);
    if ((alloc->small_class).effective_size <= uVar15) {
      bVar1 = (byte)(alloc->small_class).effective_bits;
      uVar13 = uVar15 >> (bVar1 & 0x1f);
      iVar8 = 0x1f;
      if (uVar13 != 0) {
        for (; uVar13 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      uVar15 = (uVar15 >> ((byte)iVar8 & 0x1f)) + (iVar8 << (bVar1 & 0x1f));
    }
    psVar2 = alloc->small_mempool_cache[uVar15].used_pool;
    if ((psVar2->pool).objsize < size) {
      __assert_fail("size <= pool->objsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x155,"void *smalloc(struct small_alloc *, size_t)");
    }
    psVar12 = (slab *)mempool_alloc(&psVar2->pool);
    if (psVar12 == (slab *)0x0) {
      uVar13 = alloc->small_mempool_cache_size;
      if (uVar13 != 0) {
        uVar21 = 0;
        do {
          psVar6 = alloc->small_mempool_cache + uVar21;
          psVar3 = alloc->small_mempool_cache[uVar21].group;
          psVar17 = psVar3->first;
          uVar14 = ((uint)((int)psVar6 - (int)psVar17) >> 3) * 0x1b;
          if (((((psVar3->active_pool_mask >> (uVar14 & 0x1f) & 1) != 0) &&
               ((psVar6->pool).slabs.stats.used < (ulong)(psVar6->pool).objsize)) &&
              (psVar6->waste < psVar3->waste_max >> 2)) &&
             (psVar20 = psVar3->last, psVar20 != psVar6)) {
            uVar14 = psVar3->active_pool_mask & ~(1 << ((byte)uVar14 & 0x1f));
            psVar3->active_pool_mask = uVar14;
            for (psVar16 = psVar17; psVar16 <= psVar20; psVar16 = psVar16 + 1) {
              uVar18 = psVar16->appropriate_pool_mask & uVar14;
              if (uVar18 == 0) goto LAB_001085f8;
              uVar7 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              psVar19 = psVar17 + uVar7;
              psVar16->used_pool = psVar19;
              if (psVar19 < psVar16) goto LAB_00108617;
              if ((psVar19->pool).objsize < (psVar16->pool).objsize) goto LAB_00108636;
            }
            slab = (psVar6->pool).spare;
            if (slab != (mslab *)0x0) {
              prVar9 = &(slab->slab).next_in_list;
              prVar4 = (slab->slab).next_in_list.prev;
              prVar5 = (slab->slab).next_in_list.next;
              prVar4->next = prVar5;
              prVar5->prev = prVar4;
              (slab->slab).next_in_list.next = prVar9;
              (slab->slab).next_in_list.prev = prVar9;
              psVar10 = &(psVar6->pool).slabs.stats.total;
              *psVar10 = *psVar10 - (slab->slab).size;
              slab_put_with_order((psVar6->pool).cache,&slab->slab);
              (psVar6->pool).spare = (mslab *)0x0;
              uVar13 = alloc->small_mempool_cache_size;
            }
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < uVar13);
      }
      psVar12 = (slab *)mempool_alloc(&psVar2->pool);
      if (psVar12 == (slab *)0x0) {
        return (slab *)0x0;
      }
    }
    psVar2 = alloc->small_mempool_cache[uVar15].used_pool;
    if (psVar2 != alloc->small_mempool_cache + uVar15) {
      uVar21 = (ulong)((psVar2->pool).objsize - alloc->small_mempool_cache[uVar15].pool.objsize) +
               alloc->small_mempool_cache[uVar15].waste;
      alloc->small_mempool_cache[uVar15].waste = uVar21;
      psVar3 = alloc->small_mempool_cache[uVar15].group;
      if (psVar3->waste_max <= uVar21) {
        psVar2 = psVar3->first;
        uVar13 = ((uint)((int)(alloc->small_mempool_cache + uVar15) - (int)psVar2) >> 3) * 0x1b;
        if ((psVar3->active_pool_mask >> (uVar13 & 0x1f) & 1) != 0) {
          __assert_fail("(small_mempool->group->active_pool_mask & (UINT32_C(1) << idx)) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                        ,0x57,"void small_mempool_activate(struct small_mempool *)");
        }
        uVar13 = 1 << ((byte)uVar13 & 0x1f) | psVar3->active_pool_mask;
        psVar3->active_pool_mask = uVar13;
        psVar6 = psVar3->last;
        for (psVar17 = psVar2; psVar17 <= psVar6; psVar17 = psVar17 + 1) {
          uVar15 = psVar17->appropriate_pool_mask & uVar13;
          if (uVar15 == 0) {
LAB_001085f8:
            __assert_fail("used_idx >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                          ,0x38,"void small_mempool_update_group(struct small_mempool *)");
          }
          uVar14 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
            }
          }
          psVar20 = psVar2 + uVar14;
          psVar17->used_pool = psVar20;
          if (psVar20 < psVar17) {
LAB_00108617:
            __assert_fail("pool->used_pool >= pool",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                          ,0x3a,"void small_mempool_update_group(struct small_mempool *)");
          }
          if ((psVar20->pool).objsize < (psVar17->pool).objsize) {
LAB_00108636:
            __assert_fail("pool->pool.objsize <= pool->used_pool->pool.objsize",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                          ,0x3b,"void small_mempool_update_group(struct small_mempool *)");
          }
        }
      }
    }
  }
  return psVar12;
}

Assistant:

void *
smalloc(struct small_alloc *alloc, size_t size)
{
	struct small_mempool *small_mempool = small_mempool_search(alloc, size);
	if (small_mempool == NULL) {
		/* Object is too large, fallback to slab_cache */
		struct slab *slab = slab_get_large(alloc->cache, size);
		if (slab == NULL)
			return NULL;
		return slab_data(slab);
	}
	struct mempool *pool = &small_mempool->used_pool->pool;
	assert(size <= pool->objsize);
	void *ptr = mempool_alloc(pool);
	if (ptr == NULL) {
		/*
		 * In case we run out of memory let's try to deactivate some
		 * pools and release their sparse slabs. It might not help tho.
		 */
		small_mempool_group_sweep_sparse(alloc);
		ptr = mempool_alloc(pool);
	}

	if (ptr != NULL && small_mempool->used_pool != small_mempool) {
		/*
		 * Waste for this allocation is the difference between
		 * the size of objects optimal (i.e. best-fit) mempool and
		 * used mempool.
		 */
		small_mempool->waste +=
			(small_mempool->used_pool->pool.objsize -
			 small_mempool->pool.objsize);
		/*
		 * In case when waste for this mempool becomes greater than
		 * or equal to waste_max, we are updating the information
		 * for the mempool group that this mempool belongs to,
		 * that it can now be used for memory allocation.
		 */
		if (small_mempool->waste >= small_mempool->group->waste_max)
			small_mempool_activate(small_mempool);
	}

	return ptr;
}